

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cc
# Opt level: O3

size_type __thiscall lf::mesh::hybrid2d::Mesh::NumEntities(Mesh *this,RefEl ref_el_type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  int iVar4;
  stringstream ss;
  string local_208;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  switch(ref_el_type.type_) {
  case kPoint:
    return (size_type)
           ((long)(this->points_).
                  super__Vector_base<lf::mesh::hybrid2d::Point,_std::allocator<lf::mesh::hybrid2d::Point>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->points_).
                  super__Vector_base<lf::mesh::hybrid2d::Point,_std::allocator<lf::mesh::hybrid2d::Point>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5);
  case kSegment:
    iVar4 = (int)((long)(this->segments_).
                        super__Vector_base<lf::mesh::hybrid2d::Segment,_std::allocator<lf::mesh::hybrid2d::Segment>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->segments_).
                        super__Vector_base<lf::mesh::hybrid2d::Segment,_std::allocator<lf::mesh::hybrid2d::Segment>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4);
    break;
  case kTria:
    iVar4 = (int)((long)(this->trias_).
                        super__Vector_base<lf::mesh::hybrid2d::Triangle,_std::allocator<lf::mesh::hybrid2d::Triangle>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->trias_).
                        super__Vector_base<lf::mesh::hybrid2d::Triangle,_std::allocator<lf::mesh::hybrid2d::Triangle>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5);
    break;
  case kQuad:
    iVar4 = (int)((long)(this->quads_).
                        super__Vector_base<lf::mesh::hybrid2d::Quadrilateral,_std::allocator<lf::mesh::hybrid2d::Quadrilateral>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->quads_).
                        super__Vector_base<lf::mesh::hybrid2d::Quadrilateral,_std::allocator<lf::mesh::hybrid2d::Quadrilateral>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4);
    iVar3 = -0x49249249;
    goto LAB_001c4b2d;
  default:
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(local_198,"Illegal entity type",0x13);
    paVar1 = &local_1e8.field_2;
    local_1e8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"false","");
    paVar2 = &local_208.field_2;
    local_208._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed(&local_1e8,&local_208,0x4d,&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    local_1e8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"false","");
    local_208._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh.cc"
               ,"");
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"");
    base::AssertionFailed(&local_1e8,&local_208,0x4d,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_1e8);
    abort();
  }
  iVar3 = -0x55555555;
LAB_001c4b2d:
  return iVar3 * iVar4;
}

Assistant:

Mesh::size_type Mesh::NumEntities(lf::base::RefEl ref_el_type) const {
  switch (ref_el_type) {
    case lf::base::RefEl::kPoint(): {
      return points_.size();
    }
    case lf::base::RefEl::kSegment(): {
      return segments_.size();
    }
    case lf::base::RefEl::kTria(): {
      return trias_.size();
    }
    case lf::base::RefEl::kQuad(): {
      return quads_.size();
    }
    default: {
      LF_ASSERT_MSG(false, "Illegal entity type");
      break;
    }
  }
  return 0;
}